

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O3

void BN_swap(BIGNUM *a,BIGNUM *b)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  uVar1 = a->flags;
  uVar2 = b->flags;
  puVar4 = a->d;
  iVar3 = a->neg;
  a->d = b->d;
  iVar5 = b->dmax;
  b->d = puVar4;
  iVar6 = a->top;
  iVar7 = a->dmax;
  a->top = b->top;
  a->dmax = iVar5;
  a->neg = b->neg;
  b->top = iVar6;
  b->dmax = iVar7;
  b->neg = iVar3;
  a->flags = uVar2 & 2 | uVar1 & 1;
  b->flags = uVar1 & 2 | uVar2 & 1;
  return;
}

Assistant:

void BN_swap(BIGNUM *a, BIGNUM *b)
{
    int flags_old_a, flags_old_b;
    BN_ULONG *tmp_d;
    int tmp_top, tmp_dmax, tmp_neg;

    bn_check_top(a);
    bn_check_top(b);

    flags_old_a = a->flags;
    flags_old_b = b->flags;

    tmp_d = a->d;
    tmp_top = a->top;
    tmp_dmax = a->dmax;
    tmp_neg = a->neg;

    a->d = b->d;
    a->top = b->top;
    a->dmax = b->dmax;
    a->neg = b->neg;

    b->d = tmp_d;
    b->top = tmp_top;
    b->dmax = tmp_dmax;
    b->neg = tmp_neg;

    a->flags =
        (flags_old_a & BN_FLG_MALLOCED) | (flags_old_b & BN_FLG_STATIC_DATA);
    b->flags =
        (flags_old_b & BN_FLG_MALLOCED) | (flags_old_a & BN_FLG_STATIC_DATA);
    bn_check_top(a);
    bn_check_top(b);
}